

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O2

void grpc_cpp_generator::anon_unknown_3::PrintHeaderClientMethodInterfaces
               (Printer *printer,Method *method,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars,bool is_public)

{
  _func_int *p_Var1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  long lVar5;
  allocator<char> local_121;
  key_type local_120;
  allocator<char> local_fc;
  allocator<char> local_fb;
  allocator<char> local_fa;
  allocator<char> local_f9;
  anon_struct_96_3_3738e6c4 async_prefixes [2];
  
  (*(method->super_CommentHolder)._vptr_CommentHolder[5])(async_prefixes);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Method",&local_121);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_120);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)async_prefixes);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)async_prefixes);
  (*(method->super_CommentHolder)._vptr_CommentHolder[6])(async_prefixes,method);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Request",&local_121);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_120);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)async_prefixes);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)async_prefixes);
  (*(method->super_CommentHolder)._vptr_CommentHolder[7])(async_prefixes,method);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Response",&local_121);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_120);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)async_prefixes);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)async_prefixes);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)async_prefixes,"Async",(allocator<char> *)&local_120);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&async_prefixes[0].method_params,", void* tag",&local_121);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&async_prefixes[0].raw_args,", tag",&local_f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(async_prefixes + 1),"PrepareAsync",&local_fa);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&async_prefixes[1].method_params,"",&local_fb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&async_prefixes[1].raw_args,"",&local_fc);
  p_Var1 = (method->super_CommentHolder)._vptr_CommentHolder[0xf];
  if (is_public) {
    iVar3 = (*p_Var1)(method);
    if ((char)iVar3 == '\0') {
      bVar2 = ClientOnlyStreaming(method);
      if (bVar2) {
        (*printer->_vptr_Printer[2])
                  (printer,vars,
                   "std::unique_ptr< ::grpc::ClientWriterInterface< $Request$>> $Method$(::grpc::ClientContext* context, $Response$* response) {\n"
                  );
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])
                  (printer,vars,
                   "return std::unique_ptr< ::grpc::ClientWriterInterface< $Request$>>($Method$Raw(context, response));\n"
                  );
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n");
        lVar5 = 2;
        while (bVar2 = lVar5 != 0, lVar5 = lVar5 + -1, bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,"AsyncPrefix",&local_121);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](vars,&local_120);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,"AsyncMethodParams",&local_121);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](vars,&local_120);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,"AsyncRawArgs",&local_121);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](vars,&local_120);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          std::__cxx11::string::~string((string *)&local_120);
          (*printer->_vptr_Printer[2])
                    (printer,vars,
                     "std::unique_ptr< ::grpc::ClientAsyncWriterInterface< $Request$>> $AsyncPrefix$$Method$(::grpc::ClientContext* context, $Response$* response, ::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n"
                    );
          (*printer->_vptr_Printer[5])(printer);
          (*printer->_vptr_Printer[2])
                    (printer,vars,
                     "return std::unique_ptr< ::grpc::ClientAsyncWriterInterface< $Request$>>($AsyncPrefix$$Method$Raw(context, response, cq$AsyncRawArgs$));\n"
                    );
          (*printer->_vptr_Printer[6])(printer);
          (*printer->_vptr_Printer[3])(printer,"}\n");
        }
      }
      else {
        bVar2 = ServerOnlyStreaming(method);
        if (bVar2) {
          (*printer->_vptr_Printer[2])
                    (printer,vars,
                     "std::unique_ptr< ::grpc::ClientReaderInterface< $Response$>> $Method$(::grpc::ClientContext* context, const $Request$& request) {\n"
                    );
          (*printer->_vptr_Printer[5])(printer);
          (*printer->_vptr_Printer[2])
                    (printer,vars,
                     "return std::unique_ptr< ::grpc::ClientReaderInterface< $Response$>>($Method$Raw(context, request));\n"
                    );
          (*printer->_vptr_Printer[6])(printer);
          (*printer->_vptr_Printer[3])(printer,"}\n");
          lVar5 = 2;
          while (bVar2 = lVar5 != 0, lVar5 = lVar5 + -1, bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_120,"AsyncPrefix",&local_121);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](vars,&local_120);
            std::__cxx11::string::_M_assign((string *)pmVar4);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_120,"AsyncMethodParams",&local_121);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](vars,&local_120);
            std::__cxx11::string::_M_assign((string *)pmVar4);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_120,"AsyncRawArgs",&local_121);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](vars,&local_120);
            std::__cxx11::string::_M_assign((string *)pmVar4);
            std::__cxx11::string::~string((string *)&local_120);
            (*printer->_vptr_Printer[2])
                      (printer,vars,
                       "std::unique_ptr< ::grpc::ClientAsyncReaderInterface< $Response$>> $AsyncPrefix$$Method$(::grpc::ClientContext* context, const $Request$& request, ::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n"
                      );
            (*printer->_vptr_Printer[5])(printer);
            (*printer->_vptr_Printer[2])
                      (printer,vars,
                       "return std::unique_ptr< ::grpc::ClientAsyncReaderInterface< $Response$>>($AsyncPrefix$$Method$Raw(context, request, cq$AsyncRawArgs$));\n"
                      );
            (*printer->_vptr_Printer[6])(printer);
            (*printer->_vptr_Printer[3])(printer,"}\n");
          }
        }
        else {
          iVar3 = (*(method->super_CommentHolder)._vptr_CommentHolder[0x12])(method);
          if ((char)iVar3 != '\0') {
            (*printer->_vptr_Printer[2])
                      (printer,vars,
                       "std::unique_ptr< ::grpc::ClientReaderWriterInterface< $Request$, $Response$>> $Method$(::grpc::ClientContext* context) {\n"
                      );
            (*printer->_vptr_Printer[5])(printer);
            (*printer->_vptr_Printer[2])
                      (printer,vars,
                       "return std::unique_ptr< ::grpc::ClientReaderWriterInterface< $Request$, $Response$>>($Method$Raw(context));\n"
                      );
            (*printer->_vptr_Printer[6])(printer);
            (*printer->_vptr_Printer[3])(printer,"}\n");
            lVar5 = 2;
            while (bVar2 = lVar5 != 0, lVar5 = lVar5 + -1, bVar2) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_120,"AsyncPrefix",&local_121);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](vars,&local_120);
              std::__cxx11::string::_M_assign((string *)pmVar4);
              std::__cxx11::string::~string((string *)&local_120);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_120,"AsyncMethodParams",&local_121);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](vars,&local_120);
              std::__cxx11::string::_M_assign((string *)pmVar4);
              std::__cxx11::string::~string((string *)&local_120);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_120,"AsyncRawArgs",&local_121);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](vars,&local_120);
              std::__cxx11::string::_M_assign((string *)pmVar4);
              std::__cxx11::string::~string((string *)&local_120);
              (*printer->_vptr_Printer[2])
                        (printer,vars,
                         "std::unique_ptr< ::grpc::ClientAsyncReaderWriterInterface< $Request$, $Response$>> $AsyncPrefix$$Method$(::grpc::ClientContext* context, ::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n"
                        );
              (*printer->_vptr_Printer[5])(printer);
              (*printer->_vptr_Printer[2])
                        (printer,vars,
                         "return std::unique_ptr< ::grpc::ClientAsyncReaderWriterInterface< $Request$, $Response$>>($AsyncPrefix$$Method$Raw(context, cq$AsyncRawArgs$));\n"
                        );
              (*printer->_vptr_Printer[6])(printer);
              (*printer->_vptr_Printer[3])(printer,"}\n");
            }
          }
        }
      }
    }
    else {
      (*printer->_vptr_Printer[2])
                (printer,vars,
                 "virtual ::grpc::Status $Method$(::grpc::ClientContext* context, const $Request$& request, $Response$* response) = 0;\n"
                );
      for (lVar5 = 0; lVar5 != 0xc0; lVar5 = lVar5 + 0x60) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"AsyncPrefix",&local_121);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](vars,&local_120);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        std::__cxx11::string::~string((string *)&local_120);
        (*printer->_vptr_Printer[2])
                  (printer,vars,
                   "std::unique_ptr< ::grpc::ClientAsyncResponseReaderInterface< $Response$>> $AsyncPrefix$$Method$(::grpc::ClientContext* context, const $Request$& request, ::grpc::CompletionQueue* cq) {\n"
                  );
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])
                  (printer,vars,
                   "return std::unique_ptr< ::grpc::ClientAsyncResponseReaderInterface< $Response$>>($AsyncPrefix$$Method$Raw(context, request, cq));\n"
                  );
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n");
      }
    }
  }
  else {
    iVar3 = (*p_Var1)(method);
    if ((char)iVar3 == '\0') {
      bVar2 = ClientOnlyStreaming(method);
      if (bVar2) {
        (*printer->_vptr_Printer[2])
                  (printer,vars,
                   "virtual ::grpc::ClientWriterInterface< $Request$>* $Method$Raw(::grpc::ClientContext* context, $Response$* response) = 0;\n"
                  );
        lVar5 = 2;
        while (bVar2 = lVar5 != 0, lVar5 = lVar5 + -1, bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,"AsyncPrefix",&local_121);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](vars,&local_120);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,"AsyncMethodParams",&local_121);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](vars,&local_120);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          std::__cxx11::string::~string((string *)&local_120);
          (*printer->_vptr_Printer[2])
                    (printer,vars,
                     "virtual ::grpc::ClientAsyncWriterInterface< $Request$>* $AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, $Response$* response, ::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n"
                    );
        }
      }
      else {
        bVar2 = ServerOnlyStreaming(method);
        if (bVar2) {
          (*printer->_vptr_Printer[2])
                    (printer,vars,
                     "virtual ::grpc::ClientReaderInterface< $Response$>* $Method$Raw(::grpc::ClientContext* context, const $Request$& request) = 0;\n"
                    );
          lVar5 = 2;
          while (bVar2 = lVar5 != 0, lVar5 = lVar5 + -1, bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_120,"AsyncPrefix",&local_121);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](vars,&local_120);
            std::__cxx11::string::_M_assign((string *)pmVar4);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_120,"AsyncMethodParams",&local_121);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](vars,&local_120);
            std::__cxx11::string::_M_assign((string *)pmVar4);
            std::__cxx11::string::~string((string *)&local_120);
            (*printer->_vptr_Printer[2])
                      (printer,vars,
                       "virtual ::grpc::ClientAsyncReaderInterface< $Response$>* $AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, const $Request$& request, ::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n"
                      );
          }
        }
        else {
          iVar3 = (*(method->super_CommentHolder)._vptr_CommentHolder[0x12])(method);
          if ((char)iVar3 != '\0') {
            (*printer->_vptr_Printer[2])
                      (printer,vars,
                       "virtual ::grpc::ClientReaderWriterInterface< $Request$, $Response$>* $Method$Raw(::grpc::ClientContext* context) = 0;\n"
                      );
            lVar5 = 2;
            while (bVar2 = lVar5 != 0, lVar5 = lVar5 + -1, bVar2) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_120,"AsyncPrefix",&local_121);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](vars,&local_120);
              std::__cxx11::string::_M_assign((string *)pmVar4);
              std::__cxx11::string::~string((string *)&local_120);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_120,"AsyncMethodParams",&local_121);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](vars,&local_120);
              std::__cxx11::string::_M_assign((string *)pmVar4);
              std::__cxx11::string::~string((string *)&local_120);
              (*printer->_vptr_Printer[2])
                        (printer,vars,
                         "virtual ::grpc::ClientAsyncReaderWriterInterface< $Request$, $Response$>* $AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, ::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n"
                        );
            }
          }
        }
      }
    }
    else {
      for (lVar5 = 0; lVar5 != 0xc0; lVar5 = lVar5 + 0x60) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"AsyncPrefix",&local_121);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](vars,&local_120);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        std::__cxx11::string::~string((string *)&local_120);
        (*printer->_vptr_Printer[2])
                  (printer,vars,
                   "virtual ::grpc::ClientAsyncResponseReaderInterface< $Response$>* $AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, const $Request$& request, ::grpc::CompletionQueue* cq) = 0;\n"
                  );
      }
    }
  }
  lVar5 = 0x60;
  do {
    (anonymous_namespace)::
    PrintHeaderClientMethodInterfaces(grpc_generator::Printer*,grpc_generator::Method_const*,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>*,bool)
    ::$_0::~__0((__0 *)((long)&async_prefixes[0].prefix._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x60;
  } while (lVar5 != -0x60);
  return;
}

Assistant:

static void PrintHeaderClientMethodInterfaces(
    grpc_generator::Printer *printer, const grpc_generator::Method *method,
    std::map<grpc::string, grpc::string> *vars, bool is_public) {
  (*vars)["Method"] = method->name();
  (*vars)["Request"] = method->input_type_name();
  (*vars)["Response"] = method->output_type_name();

  struct {
    grpc::string prefix;
    grpc::string method_params;  // extra arguments to method
    grpc::string raw_args;       // extra arguments to raw version of method
  } async_prefixes[] = { { "Async", ", void* tag", ", tag" },
                         { "PrepareAsync", "", "" } };

  if (is_public) {
    if (method->NoStreaming()) {
      printer->Print(
          *vars,
          "virtual ::grpc::Status $Method$(::grpc::ClientContext* context, "
          "const $Request$& request, $Response$* response) = 0;\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        printer->Print(
            *vars,
            "std::unique_ptr< "
            "::grpc::ClientAsyncResponseReaderInterface< $Response$>> "
            "$AsyncPrefix$$Method$(::grpc::ClientContext* context, "
            "const $Request$& request, "
            "::grpc::CompletionQueue* cq) {\n");
        printer->Indent();
        printer->Print(
            *vars,
            "return std::unique_ptr< "
            "::grpc::ClientAsyncResponseReaderInterface< $Response$>>("
            "$AsyncPrefix$$Method$Raw(context, request, cq));\n");
        printer->Outdent();
        printer->Print("}\n");
      }
    } else if (ClientOnlyStreaming(method)) {
      printer->Print(
          *vars,
          "std::unique_ptr< ::grpc::ClientWriterInterface< $Request$>>"
          " $Method$("
          "::grpc::ClientContext* context, $Response$* response) {\n");
      printer->Indent();
      printer->Print(
          *vars,
          "return std::unique_ptr< ::grpc::ClientWriterInterface< $Request$>>"
          "($Method$Raw(context, response));\n");
      printer->Outdent();
      printer->Print("}\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        (*vars)["AsyncRawArgs"] = async_prefix.raw_args;
        printer->Print(
            *vars,
            "std::unique_ptr< ::grpc::ClientAsyncWriterInterface< $Request$>>"
            " $AsyncPrefix$$Method$(::grpc::ClientContext* context, "
            "$Response$* "
            "response, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n");
        printer->Indent();
        printer->Print(*vars,
                       "return std::unique_ptr< "
                       "::grpc::ClientAsyncWriterInterface< $Request$>>("
                       "$AsyncPrefix$$Method$Raw(context, response, "
                       "cq$AsyncRawArgs$));\n");
        printer->Outdent();
        printer->Print("}\n");
      }
    } else if (ServerOnlyStreaming(method)) {
      printer->Print(
          *vars,
          "std::unique_ptr< ::grpc::ClientReaderInterface< $Response$>>"
          " $Method$(::grpc::ClientContext* context, const $Request$& request)"
          " {\n");
      printer->Indent();
      printer->Print(
          *vars,
          "return std::unique_ptr< ::grpc::ClientReaderInterface< $Response$>>"
          "($Method$Raw(context, request));\n");
      printer->Outdent();
      printer->Print("}\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        (*vars)["AsyncRawArgs"] = async_prefix.raw_args;
        printer->Print(
            *vars,
            "std::unique_ptr< ::grpc::ClientAsyncReaderInterface< $Response$>> "
            "$AsyncPrefix$$Method$("
            "::grpc::ClientContext* context, const $Request$& request, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n");
        printer->Indent();
        printer->Print(
            *vars,
            "return std::unique_ptr< "
            "::grpc::ClientAsyncReaderInterface< $Response$>>("
            "$AsyncPrefix$$Method$Raw(context, request, cq$AsyncRawArgs$));\n");
        printer->Outdent();
        printer->Print("}\n");
      }
    } else if (method->BidiStreaming()) {
      printer->Print(*vars,
                     "std::unique_ptr< ::grpc::ClientReaderWriterInterface< "
                     "$Request$, $Response$>> "
                     "$Method$(::grpc::ClientContext* context) {\n");
      printer->Indent();
      printer->Print(
          *vars,
          "return std::unique_ptr< "
          "::grpc::ClientReaderWriterInterface< $Request$, $Response$>>("
          "$Method$Raw(context));\n");
      printer->Outdent();
      printer->Print("}\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        (*vars)["AsyncRawArgs"] = async_prefix.raw_args;
        printer->Print(
            *vars,
            "std::unique_ptr< "
            "::grpc::ClientAsyncReaderWriterInterface< $Request$, $Response$>> "
            "$AsyncPrefix$$Method$(::grpc::ClientContext* context, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n");
        printer->Indent();
        printer->Print(
            *vars,
            "return std::unique_ptr< "
            "::grpc::ClientAsyncReaderWriterInterface< $Request$, $Response$>>("
            "$AsyncPrefix$$Method$Raw(context, cq$AsyncRawArgs$));\n");
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  } else {
    if (method->NoStreaming()) {
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        printer->Print(
            *vars,
            "virtual ::grpc::ClientAsyncResponseReaderInterface< $Response$>* "
            "$AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, "
            "const $Request$& request, "
            "::grpc::CompletionQueue* cq) = 0;\n");
      }
    } else if (ClientOnlyStreaming(method)) {
      printer->Print(
          *vars,
          "virtual ::grpc::ClientWriterInterface< $Request$>*"
          " $Method$Raw("
          "::grpc::ClientContext* context, $Response$* response) = 0;\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        printer->Print(
            *vars,
            "virtual ::grpc::ClientAsyncWriterInterface< $Request$>*"
            " $AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, "
            "$Response$* response, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n");
      }
    } else if (ServerOnlyStreaming(method)) {
      printer->Print(
          *vars,
          "virtual ::grpc::ClientReaderInterface< $Response$>* "
          "$Method$Raw("
          "::grpc::ClientContext* context, const $Request$& request) = 0;\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        printer->Print(
            *vars,
            "virtual ::grpc::ClientAsyncReaderInterface< $Response$>* "
            "$AsyncPrefix$$Method$Raw("
            "::grpc::ClientContext* context, const $Request$& request, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n");
      }
    } else if (method->BidiStreaming()) {
      printer->Print(*vars,
                     "virtual ::grpc::ClientReaderWriterInterface< $Request$, "
                     "$Response$>* "
                     "$Method$Raw(::grpc::ClientContext* context) = 0;\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        printer->Print(
            *vars,
            "virtual ::grpc::ClientAsyncReaderWriterInterface< "
            "$Request$, $Response$>* "
            "$AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n");
      }
    }
  }
}